

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O3

int __thiscall embree::Token::Int(Token *this)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  if (this->ty == TY_INT) {
    return (this->field_1).i;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,&this->loc);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Int() const {
      if (ty == TY_INT) return i;
      THROW_RUNTIME_ERROR(loc.str()+": integer expected");
    }